

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.cc
# Opt level: O1

void __thiscall avro::NodeEnum::printJson(NodeEnum *this,ostream *os,int depth)

{
  pointer pbVar1;
  int iVar2;
  ostream *poVar3;
  indent x;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  char local_40 [4];
  indent local_3c;
  ulong local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"{\n",2);
  x.d = depth + 1;
  local_38 = (ulong)(uint)depth;
  operator<<(os,x);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\"type\": \"enum\",\n",0x10);
  printName(os,&(this->super_NodeImplEnum).nameAttribute_.attr_,x.d);
  local_3c.d = x.d;
  operator<<(os,x);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\"symbols\": [\n",0xd);
  uVar6 = (uint)((ulong)((long)(this->super_NodeImplEnum).leafNameAttributes_.attrs_.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->super_NodeImplEnum).leafNameAttributes_.attrs_.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 5);
  if (0 < (int)uVar6) {
    iVar2 = (int)local_38;
    lVar4 = 8;
    uVar5 = 0;
    do {
      if (uVar5 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(os,",\n",2);
      }
      operator<<(os,(indent)(iVar2 + 2));
      local_40[0] = '\"';
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,local_40,1);
      pbVar1 = (this->super_NodeImplEnum).leafNameAttributes_.attrs_.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->super_NodeImplEnum).leafNameAttributes_.attrs_.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar5) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar5
                  );
      }
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,*(char **)((long)pbVar1 + lVar4 + -8),
                          *(long *)((long)&(pbVar1->_M_dataplus)._M_p + lVar4));
      local_40[1] = 0x22;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_40 + 1,1);
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x20;
    } while ((uVar6 & 0x7fffffff) != uVar5);
  }
  local_40[2] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_40 + 2,1);
  operator<<(os,local_3c);
  std::__ostream_insert<char,std::char_traits<char>>(os,"]\n",2);
  operator<<(os,(indent)(int)local_38);
  local_40[3] = 0x7d;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_40 + 3,1);
  return;
}

Assistant:

void 
NodeEnum::printJson(std::ostream &os, int depth) const
{
    os << "{\n";
    os << indent(++depth) << "\"type\": \"enum\",\n";
    printName(os, nameAttribute_.get(), depth);
    os << indent(depth) << "\"symbols\": [\n";

    int names = leafNameAttributes_.size();
    ++depth;
    for(int i = 0; i < names; ++i) {
        if(i > 0) {
            os << ",\n";
        }
        os << indent(depth) << '\"' << leafNameAttributes_.get(i) << '\"';
    }
    os << '\n';
    os << indent(--depth) << "]\n";
    os << indent(--depth) << '}';
}